

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O3

curlioerr ioctl_callback(CURL *handle,int cmd,void *clientp)

{
  if (cmd == 1) {
    curl_mprintf("APPLICATION: received a CURLIOCMD_RESTARTREAD request\n");
    curl_mprintf("APPLICATION: ** REWINDING! **\n");
    current_offset = 0;
  }
  return (uint)(cmd != 1);
}

Assistant:

static curlioerr ioctl_callback(CURL *handle, int cmd, void *clientp)
{
  (void)clientp;
  if(cmd == CURLIOCMD_RESTARTREAD) {
    printf("APPLICATION: received a CURLIOCMD_RESTARTREAD request\n");
    printf("APPLICATION: ** REWINDING! **\n");
    current_offset = 0;
    return CURLIOE_OK;
  }
  (void)handle;
  return CURLIOE_UNKNOWNCMD;
}